

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementLog.cpp
# Opt level: O1

void __thiscall Rml::Debugger::ElementLog::~ElementLog(ElementLog *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  
  this_00 = &this[-1].log_types[2].alert_contents.field_2;
  ~ElementLog((ElementLog *)this_00);
  operator_delete(this_00,0x518);
  return;
}

Assistant:

ElementLog::~ElementLog()
{
	RemoveEventListener(EventId::Click, this);

	if (beacon && beacon->GetFirstChild())
		beacon->GetFirstChild()->RemoveEventListener(EventId::Click, this);

	if (beacon && beacon->GetParentNode())
		beacon->GetParentNode()->RemoveChild(beacon);

	if (message_content)
	{
		message_content->RemoveEventListener(EventId::Resize, this);
	}
}